

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProtocolTCP.cpp
# Opt level: O3

TCPConnection * __thiscall
ProtocolTCP::LocateConnection
          (ProtocolTCP *this,uint16_t remotePort,uint8_t *remoteAddress,uint16_t localPort)

{
  bool bVar1;
  size_t sVar2;
  uint8_t *a1;
  long lVar3;
  
  a1 = &this->field_0x8;
  lVar3 = 5;
  do {
    if ((*(uint16_t *)(a1 + -4) == localPort) && (*(uint16_t *)(a1 + -2) == remotePort)) {
      sVar2 = ProtocolIPv4::AddressSize(this->IP);
      bVar1 = AddressCompare(a1,remoteAddress,(int)sVar2);
      if (bVar1) {
        return (TCPConnection *)(a1 + -8);
      }
    }
    a1 = a1 + 0x370;
    lVar3 = lVar3 + -1;
  } while (lVar3 != 0);
  lVar3 = 0;
  while ((*(uint16_t *)(&this->field_0x4 + lVar3) != localPort ||
         (*(int *)(&this->field_0x0 + lVar3) != 1))) {
    lVar3 = lVar3 + 0x370;
    if (lVar3 == 0x1130) {
      return (TCPConnection *)0x0;
    }
  }
  return (TCPConnection *)(&this->field_0x0 + lVar3);
}

Assistant:

TCPConnection* ProtocolTCP::LocateConnection(uint16_t remotePort,
                                             const uint8_t* remoteAddress,
                                             uint16_t localPort)
{
    int i;

    // Must do two passes:
    // First pass to look for established connections
    // Second pass to look for listening connections

    // Pass 1
    for (i = 0; i < TCP_MAX_CONNECTIONS; i++)
    {
        // printf("%s %d: connection port %d, state %s\n",
        //        FindFileName(__FILE__),
        //        __LINE__,
        //        ConnectionList[i].LocalPort,
        //        ConnectionList[i].GetStateString());
        if (ConnectionList[i].LocalPort == localPort &&
            ConnectionList[i].RemotePort == remotePort &&
            AddressCompare(ConnectionList[i].RemoteAddress, remoteAddress, IP.AddressSize()))
        {
            return &ConnectionList[i];
        }
    }

    // Pass 2
    for (i = 0; i < TCP_MAX_CONNECTIONS; i++)
    {
        if (ConnectionList[i].LocalPort == localPort &&
            ConnectionList[i].State == TCPConnection::LISTEN)
        {
            return &ConnectionList[i];
        }
    }

    return nullptr;
}